

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

void __thiscall TasgridWrapper::processEvalLike(TasgridWrapper *this)

{
  TypeCommand TVar1;
  byte bVar2;
  runtime_error *this_00;
  vector *__n;
  int *piVar3;
  void *__buf;
  int iVar4;
  long lVar5;
  Data2D<double> x;
  Data2D<double> result;
  internal_sparse_matrix matrix;
  Data2D<double> local_e0;
  long local_b8;
  pointer piStack_b0;
  vector<double,_std::allocator<double>_> local_a8;
  undefined1 local_88 [8];
  pointer piStack_80;
  undefined1 local_78 [16];
  pointer pdStack_68;
  pointer local_60;
  pointer piStack_58;
  pointer local_50;
  pointer pdStack_48;
  pointer local_40;
  pointer local_38;
  pointer pdStack_30;
  pointer local_28;
  
  lVar5 = *(long *)&this->field_0x8;
  if (lVar5 == 0) {
    iVar4 = 0;
  }
  else {
    piVar3 = (int *)(lVar5 + 0x20);
    if (*(long *)(lVar5 + 0x28) == *(long *)(lVar5 + 0x30)) {
      piVar3 = (int *)(lVar5 + 0x48);
    }
    iVar4 = *piVar3;
  }
  if (this->pass_flag != true) {
    return;
  }
  verifiedRead(&local_e0,this,&this->xfilename,this->num_dimensions);
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8 = 0;
  piStack_b0 = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TVar1 = this->command;
  switch(TVar1) {
  case command_getinterweights:
    piStack_80 = (pointer)(long)(int)(uint)local_e0.num_strips;
    local_88 = (undefined1  [8])(long)iVar4;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,(long)piStack_80 * (long)local_88
               ,(allocator_type *)&local_38);
    local_b8 = (long)local_88;
    piStack_b0 = piStack_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_a8,(vector<double,_std::allocator<double>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,(long)pdStack_68 - local_78._0_8_);
    }
    if (0 < (int)(uint)local_e0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::getInterpolationWeights
                  ((double *)this,
                   local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_e0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_e0.num_strips);
    }
    break;
  case command_getdiffweights:
    local_88 = (undefined1  [8])((long)iVar4 * (long)this->num_dimensions);
    piStack_80 = (pointer)(long)(int)(uint)local_e0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,(long)local_88 * (long)piStack_80
               ,(allocator_type *)&local_38);
    local_b8 = (long)local_88;
    piStack_b0 = piStack_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_a8,(vector<double,_std::allocator<double>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,(long)pdStack_68 - local_78._0_8_);
    }
    if (0 < (int)(uint)local_e0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::getDifferentiationWeights
                  ((double *)this,
                   local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_e0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_e0.num_strips);
    }
    break;
  case command_getpoints:
  case command_getneeded:
  case command_loadvalues:
  case command_integrate:
switchD_001300ea_caseD_d:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: internal problem, processEvalLike() called with wrong command");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case command_evaluate:
    local_88 = (undefined1  [8])(long)this->num_outputs;
    piStack_80 = (pointer)(long)(int)(uint)local_e0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,(long)piStack_80 * (long)local_88
               ,(allocator_type *)&local_38);
    local_b8 = (long)local_88;
    piStack_b0 = piStack_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_a8,(vector<double,_std::allocator<double>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,(long)pdStack_68 - local_78._0_8_);
    }
    TasGrid::TasmanianSparseGrid::evaluateBatch
              ((double *)this,
               (int)local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)local_e0.num_strips);
    break;
  case command_differentiate:
    local_88 = (undefined1  [8])((long)this->num_dimensions * (long)this->num_outputs);
    piStack_80 = (pointer)(long)(int)(uint)local_e0.num_strips;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,(long)local_88 * (long)piStack_80
               ,(allocator_type *)&local_38);
    local_b8 = (long)local_88;
    piStack_b0 = piStack_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_a8,(vector<double,_std::allocator<double>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,(long)pdStack_68 - local_78._0_8_);
    }
    if (0 < (int)(uint)local_e0.num_strips) {
      lVar5 = 0;
      do {
        TasGrid::TasmanianSparseGrid::differentiate
                  ((double *)this,
                   local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + local_e0.stride * lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)(uint)local_e0.num_strips);
    }
    break;
  default:
    if (TVar1 == command_evalhierarchical_sparse) {
      local_88._0_4_ = iVar4;
      piStack_80 = (pointer)0x0;
      local_78._0_8_ = (pointer)0x0;
      local_78._8_8_ = (pointer)0x0;
      pdStack_68 = (pointer)0x0;
      local_60 = (pointer)0x0;
      piStack_58 = (pointer)0x0;
      local_50 = (pointer)0x0;
      pdStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      local_38 = local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pdStack_30 = local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_28 = local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n = (vector *)&pdStack_68;
      TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
                ((vector *)this,(vector *)&local_38,(vector *)&piStack_80,__n);
      if (local_38 != (pointer)0x0) {
        operator_delete(local_38,(long)local_28 - (long)local_38);
      }
      internal_sparse_matrix::write
                ((internal_sparse_matrix *)local_88,(int)this + 0x180,(void *)(ulong)this->useASCII,
                 (size_t)__n);
      internal_sparse_matrix::write
                ((internal_sparse_matrix *)local_88,(uint)this->printCout,__buf,(size_t)__n);
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50,(long)local_40 - (long)local_50);
      }
      if (pdStack_68 != (pointer)0x0) {
        operator_delete(pdStack_68,(long)piStack_58 - (long)pdStack_68);
      }
      if (piStack_80 != (pointer)0x0) {
        operator_delete(piStack_80,local_78._8_8_ - (long)piStack_80);
      }
      goto LAB_00130538;
    }
    if (TVar1 != command_evalhierarchical_dense) goto switchD_001300ea_caseD_d;
    if (*(long **)&this->field_0x8 == (long *)0x0) {
      bVar2 = 0;
    }
    else {
      bVar2 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
    }
    piStack_80 = (pointer)(long)(int)(uint)local_e0.num_strips;
    local_88 = (undefined1  [8])(long)(iVar4 << (bVar2 & 0x1f));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,(long)piStack_80 * (long)local_88
               ,(allocator_type *)&local_38);
    local_b8 = (long)local_88;
    piStack_b0 = piStack_80;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_a8,(vector<double,_std::allocator<double>_> *)local_78);
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_78._0_8_,(long)pdStack_68 - local_78._0_8_);
    }
    TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
              ((double *)this,
               (int)local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)local_e0.num_strips);
  }
  writeMatrix(this,&this->outfilename,(int)piStack_b0,(int)local_b8,
              local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  printMatrix(this,(int)piStack_b0,(int)local_b8,
              local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,false);
LAB_00130538:
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::processEvalLike() const{
    int num_points = grid.getNumPoints();
    if (not pass_flag) return;

    auto x = verifiedRead(xfilename, num_dimensions);

    Data2D<double> result;
    switch(command){
        case command_evaluate:
            result = Data2D<double>(num_outputs, x.getNumStrips());
            grid.evaluateBatch(x.data(), x.getNumStrips(), result.data());
            break;
        case command_differentiate:
            result = Data2D<double>(num_outputs * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for (int i=0; i<x.getNumStrips(); i++)
                grid.differentiate(x.getStrip(i), result.getStrip(i));
            break;
        case command_getinterweights:
            result = Data2D<double>(num_points, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getInterpolationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_getdiffweights:
            result = Data2D<double>(num_points * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getDifferentiationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_evalhierarchical_dense:
            result = Data2D<double>(num_points * (grid.isFourier() ? 2 : 1), x.getNumStrips());
            grid.evaluateHierarchicalFunctions(x.data(), x.getNumStrips(), result.data());
            break;
        case command_evalhierarchical_sparse:
        { // scope is needed to declare sparse variables
            internal_sparse_matrix matrix(num_points);
            grid.evaluateSparseHierarchicalFunctions(x.release(), matrix.pntr, matrix.indx, matrix.vals);
            matrix.write(outfilename, useASCII);
            matrix.write(printCout);
            return; // after this, there is output section but invalid for this command
        }
            break;
        default:
            throw std::runtime_error("ERROR: internal problem, processEvalLike() called with wrong command");
            break;
    }

    writeMatrix(outfilename, result);
    printMatrix(result);
}